

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linear_hash.c
# Opt level: O0

void test_linear_hash_get
               (planck_unit_test_t *tc,ion_key_t key,ion_err_t expected_status,
               ion_result_count_t expected_count,ion_value_t expected_value,
               linear_hash_table_t *linear_hash)

{
  long lVar1;
  planck_unit_test_t *ppVar2;
  ion_result_count_t actual;
  ion_status_t iVar3;
  planck_unit_result_t pVar4;
  void *__s;
  ion_status_t __dest;
  int iVar5;
  undefined8 uStack_60;
  planck_unit_test_t *local_58;
  planck_unit_test_t *local_50;
  ion_status_t local_48;
  ion_status_t status;
  ion_value_t retval;
  ion_value_t defaultval;
  linear_hash_table_t *linear_hash_local;
  ion_value_t expected_value_local;
  ion_result_count_t expected_count_local;
  ion_err_t expected_status_local;
  ion_key_t key_local;
  planck_unit_test_t *tc_local;
  
  lVar1 = -((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_58 + lVar1);
  iVar5 = (linear_hash->super).record.value_size;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x101633;
  memset(__s,0x76,(long)iVar5);
  __dest = (ion_status_t)
           ((long)__s - ((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0));
  iVar5 = (linear_hash->super).record.value_size;
  status = __dest;
  *(undefined8 *)((long)__dest + -8) = 0x101665;
  memcpy((void *)__dest,__s,(long)iVar5);
  iVar3 = status;
  *(undefined8 *)((long)__dest + -8) = 0x101676;
  local_48 = linear_hash_get((ion_byte_t *)key,(ion_byte_t *)iVar3,linear_hash);
  iVar5 = (int)local_48.error;
  *(undefined8 *)((long)__dest + -8) = 0x101697;
  pVar4 = planck_unit_assert_int_are_equal
                    (tc,(int)expected_status,iVar5,0x7f,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                    );
  if (pVar4 == '\0') {
    *(undefined8 *)((long)__dest + -8) = 0x1016b1;
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  actual = local_48.count;
  *(undefined8 *)((long)__dest + -8) = 0x1016cc;
  pVar4 = planck_unit_assert_int_are_equal
                    (tc,expected_count,actual,0x80,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                    );
  iVar3 = status;
  if (pVar4 != '\0') {
    if (local_48.error == '\0') {
      iVar5 = (linear_hash->super).record.value_size;
      local_50 = tc;
      *(undefined8 *)((long)__dest + -8) = 0x10170d;
      iVar5 = memcmp(expected_value,(void *)iVar3,(long)iVar5);
      ppVar2 = local_50;
      *(undefined8 *)((long)__dest + -8) = 0x101726;
      pVar4 = planck_unit_assert_int_are_equal
                        (ppVar2,0,iVar5,0x83,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                        );
      if (pVar4 == '\0') {
        *(undefined8 *)((long)__dest + -8) = 0x101740;
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
    }
    else {
      iVar5 = (linear_hash->super).record.value_size;
      local_58 = tc;
      *(undefined8 *)((long)__dest + -8) = 0x10175f;
      iVar5 = memcmp(__s,(void *)iVar3,(long)iVar5);
      ppVar2 = local_58;
      *(undefined8 *)((long)__dest + -8) = 0x101778;
      pVar4 = planck_unit_assert_int_are_equal
                        (ppVar2,0,iVar5,0x87,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                        );
      if (pVar4 == '\0') {
        *(undefined8 *)((long)__dest + -8) = 0x101792;
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
    }
    return;
  }
  *(undefined8 *)((long)__dest + -8) = 0x1016e6;
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_linear_hash_get(
	planck_unit_test_t	*tc,
	ion_key_t			key,
	ion_err_t			expected_status,
	ion_result_count_t	expected_count,
	ion_value_t			expected_value,
	linear_hash_table_t *linear_hash
) {
	ion_value_t defaultval = alloca(linear_hash->super.record.value_size);

	memset(defaultval, 0x76, linear_hash->super.record.value_size);

	ion_value_t retval = alloca(linear_hash->super.record.value_size);

	memcpy(retval, defaultval, linear_hash->super.record.value_size);

	ion_status_t status = linear_hash_get(key, retval, linear_hash);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (err_ok == status.error) {
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(expected_value, retval, linear_hash->super.record.value_size));
	}
	else {
		/* Here, we check to see that the passed in space to write the value remains unchanged, if we have an error condition. */
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(defaultval, retval, linear_hash->super.record.value_size));
	}
}